

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int MRIStepGetDky(void *arkode_mem,realtype t,int k,N_Vector dky)

{
  N_Vector in_RDI;
  ARKodeMem ark_mem;
  ARKodeMem in_stack_00000008;
  int retval;
  int in_stack_fffffffffffffffc;
  int iVar1;
  
  if (in_RDI == (N_Vector)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::MRIStep","MRIStepGetDky",
                    "arkode_mem = NULL illegal.");
    iVar1 = -0x15;
  }
  else {
    iVar1 = arkGetDky(in_stack_00000008,(realtype)ark_mem,in_stack_fffffffffffffffc,in_RDI);
  }
  return iVar1;
}

Assistant:

int MRIStepGetDky(void *arkode_mem, realtype t, int k, N_Vector dky)
{
  /* unpack ark_mem, call arkGetDky, and return */
  int retval;
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::MRIStep",
                    "MRIStepGetDky", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  SUNDIALS_MARK_FUNCTION_BEGIN(ARK_PROFILER);
  retval = arkGetDky(ark_mem, t, k, dky);
  SUNDIALS_MARK_FUNCTION_END(ARK_PROFILER);
  return(retval);
}